

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxReturnStatement::Emit(FxReturnStatement *this,VMFunctionBuilder *build)

{
  int opb;
  uint extraout_var;
  VMFunctionBuilder *build_local;
  FxReturnStatement *this_local;
  ExpEmit out;
  
  ExpEmit::ExpEmit((ExpEmit *)&this_local,0,0x80,false,false);
  if (this->Value == (FxExpression *)0x0) {
    VMFunctionBuilder::Emit(build,0x4e,0x80,0x80,0);
  }
  else {
    this_local._0_4_ = (*this->Value->_vptr_FxExpression[9])(this->Value,build);
    this_local._4_1_ = (bool)(char)extraout_var;
    this_local._5_1_ = (bool)(char)(extraout_var >> 8);
    this_local._6_1_ = (bool)(char)(extraout_var >> 0x10);
    this_local._7_1_ = (char)(extraout_var >> 0x18);
    if ((extraout_var & 0x10000) == 0) {
      if (this->Value->ValueType == &TypeVoid->super_PType) {
        VMFunctionBuilder::Emit(build,0x4e,0x80,0x80,0);
      }
      else {
        opb = EncodeRegType((ExpEmit)this_local);
        VMFunctionBuilder::Emit(build,0x4e,0x80,opb,(uint)(ushort)this_local);
      }
    }
  }
  this_local._0_7_ = CONCAT16(1,this_local._0_6_);
  return (ExpEmit)this_local;
}

Assistant:

ExpEmit FxReturnStatement::Emit(VMFunctionBuilder *build)
{
	ExpEmit out(0, REGT_NIL);

	// If we return nothing, use a regular RET opcode.
	// Otherwise just return the value we're given.
	if (Value == nullptr)
	{
		build->Emit(OP_RET, RET_FINAL, REGT_NIL, 0);
	}
	else
	{
		out = Value->Emit(build);

		// Check if it is a function call that simplified itself
		// into a tail call in which case we don't emit anything.
		if (!out.Final)
		{
			if (Value->ValueType == TypeVoid)
			{ // Nothing is returned.
				build->Emit(OP_RET, RET_FINAL, REGT_NIL, 0);
			}
			else
			{
				build->Emit(OP_RET, RET_FINAL, EncodeRegType(out), out.RegNum);
			}
		}
	}

	out.Final = true;
	return out;
}